

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

Reals __thiscall
Omega_h::diffuse_densities_once
          (Omega_h *this,Mesh *mesh,Graph *g,Reals *densities,Reals *cell_sizes)

{
  double dVar1;
  int iVar2;
  Int IVar3;
  uint uVar4;
  void *extraout_RDX;
  long lVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  Reals RVar9;
  Write<double> local_178;
  Write<double> local_168;
  Write<double> out;
  undefined1 local_148 [40];
  long local_120;
  int local_118;
  Write<signed_char> local_110;
  Write<signed_char> local_100;
  Write<double> local_f0;
  Write<double> local_e0;
  Graph local_d0;
  int local_b0;
  Write<double> local_a8;
  Write<double> local_98;
  type f;
  
  Write<double>::Write(&local_f0,&densities->write_);
  std::__cxx11::string::string((string *)local_148,"",(allocator *)&local_e0);
  deep_copy<double>((Omega_h *)&out,(Read<signed_char> *)&local_f0,(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  Write<double>::~Write(&local_f0);
  IVar3 = Mesh::dim(mesh);
  Write<double>::Write((Write<double> *)&f,&cell_sizes->write_);
  Graph::Graph(&f.g,g);
  f.max_deg = IVar3 + 1;
  Write<double>::Write(&f.densities.write_,&densities->write_);
  Write<double>::Write(&f.out,&out);
  uVar4 = Mesh::nelems(mesh);
  Write<double>::Write(&local_e0,(Write<double> *)&f);
  Graph::Graph(&local_d0,&f.g);
  local_b0 = f.max_deg;
  Write<double>::Write(&local_a8,&f.densities.write_);
  Write<double>::Write(&local_98,&f.out);
  if (0 < (int)uVar4) {
    entering_parallel = 1;
    Write<double>::Write((Write<signed_char> *)local_148,(Write<signed_char> *)&local_e0);
    Graph::Graph((Graph *)(local_148 + 0x10),&local_d0);
    local_118 = local_b0;
    Write<double>::Write(&local_110,(Write<signed_char> *)&local_a8);
    Write<double>::Write(&local_100,(Write<signed_char> *)&local_98);
    entering_parallel = 0;
    for (uVar6 = 0; uVar6 != uVar4; uVar6 = uVar6 + 1) {
      dVar1 = *(double *)(local_148._8_8_ + uVar6 * 8);
      iVar2 = *(int *)(local_148._24_8_ + 4 + uVar6 * 4);
      for (lVar7 = (long)*(int *)(local_148._24_8_ + uVar6 * 4); lVar7 < iVar2; lVar7 = lVar7 + 1) {
        lVar5 = (long)*(int *)(local_120 + lVar7 * 4);
        dVar8 = *(double *)(local_148._8_8_ + lVar5 * 8);
        if (dVar1 <= dVar8) {
          dVar8 = dVar1;
        }
        *(double *)((long)local_100.shared_alloc_.direct_ptr + uVar6 * 8) =
             (*(double *)((long)local_110.shared_alloc_.direct_ptr + lVar5 * 8) -
             *(double *)((long)local_110.shared_alloc_.direct_ptr + uVar6 * 8)) *
             (dVar8 / ((double)local_118 * dVar1)) +
             *(double *)((long)local_100.shared_alloc_.direct_ptr + uVar6 * 8);
      }
    }
    diffuse_densities_once(Omega_h::Mesh*,Omega_h::Graph,Omega_h::Read<double>,Omega_h::Read<double>)
    ::$_0::~__0((__0 *)local_148);
  }
  diffuse_densities_once(Omega_h::Mesh*,Omega_h::Graph,Omega_h::Read<double>,Omega_h::Read<double>)
  ::$_0::~__0((__0 *)&local_e0);
  uVar4 = Mesh::dim(mesh);
  Write<double>::Write(&local_178,&out);
  Read<double>::Read((Read<signed_char> *)&local_168,&local_178);
  Mesh::sync_array<double>((Mesh *)this,(Int)mesh,(Read<double> *)(ulong)uVar4,(Int)&local_168);
  Write<double>::~Write(&local_168);
  Write<double>::~Write(&local_178);
  diffuse_densities_once(Omega_h::Mesh*,Omega_h::Graph,Omega_h::Read<double>,Omega_h::Read<double>)
  ::$_0::~__0((__0 *)&f);
  Write<double>::~Write(&out);
  RVar9.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar9.write_.shared_alloc_;
}

Assistant:

Reals diffuse_densities_once(
    Mesh* mesh, Graph g, Reals densities, Reals cell_sizes) {
  auto out = deep_copy(densities);
  auto max_deg = mesh->dim() + 1;
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto s = cell_sizes[e];
    for (auto ee = g.a2ab[e]; ee < g.a2ab[e + 1]; ++ee) {
      auto oe = g.ab2b[ee];
      auto os = cell_sizes[oe];
      auto mins = min2(s, os);  // minimum of this and other cell size
      /* get difference in densities, multiply by (mins / max_deg)
         to get a mass value that is below the stable limit,
         then divide that mass value by (s) to get the density
         delta to add to this density */
      auto factor = mins / (s * max_deg);
      auto x = densities[e];
      auto ox = densities[oe];
      out[e] += (ox - x) * factor;
    }
  };
  parallel_for(mesh->nelems(), f, "diffuse_densities");
  return mesh->sync_array(mesh->dim(), Reals(out), 1);
}